

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall FNodeBuilder::FLevel::FindMapBounds(FLevel *this)

{
  double dVar1;
  DVector2 DVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  line_t *plVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  DVar2 = this->Vertices->p;
  uVar7 = DVar2.X._0_4_;
  uVar8 = DVar2.X._4_4_;
  uVar9 = DVar2.Y._0_4_;
  uVar10 = DVar2.Y._4_4_;
  dVar11 = DVar2.X;
  dVar12 = DVar2.Y;
  if (1 < (long)this->NumLines) {
    lVar5 = 1;
    dVar14 = dVar12;
    do {
      dVar13 = dVar14;
      bVar4 = true;
      do {
        bVar3 = bVar4;
        plVar6 = (line_t *)&this->Lines[lVar5].v2;
        if (bVar3) {
          plVar6 = this->Lines + lVar5;
        }
        dVar14 = (plVar6->v1->p).X;
        if ((double)CONCAT44(uVar8,uVar7) < dVar14 || (double)CONCAT44(uVar8,uVar7) == dVar14) {
          if (dVar11 < dVar14) {
            dVar11 = dVar14;
          }
        }
        else {
          uVar7 = SUB84(dVar14,0);
          uVar8 = (undefined4)((ulong)dVar14 >> 0x20);
        }
        dVar1 = (plVar6->v1->p).Y;
        dVar14 = dVar1;
        if ((dVar13 <= dVar1) && (dVar14 = dVar13, dVar12 < dVar1)) {
          dVar12 = dVar1;
        }
        dVar13 = dVar14;
        bVar4 = false;
      } while (bVar3);
      lVar5 = lVar5 + 1;
    } while (lVar5 != this->NumLines);
    uVar9 = SUB84(dVar14,0);
    uVar10 = (undefined4)((ulong)dVar14 >> 0x20);
  }
  this->MinX = SUB84((double)CONCAT44(uVar8,uVar7) + 103079215104.0,0);
  this->MinY = SUB84((double)CONCAT44(uVar10,uVar9) + 103079215104.0,0);
  this->MaxX = SUB84(dVar11 + 103079215104.0,0);
  this->MaxY = SUB84(dVar12 + 103079215104.0,0);
  return;
}

Assistant:

void FNodeBuilder::FLevel::FindMapBounds()
{
	double minx, maxx, miny, maxy;

	minx = maxx = Vertices[0].fX();
	miny = maxy = Vertices[0].fY();

	for (int i = 1; i < NumLines; ++i)
	{
		for (int j = 0; j < 2; j++)
		{
			vertex_t *v = (j == 0 ? Lines[i].v1 : Lines[i].v2);
			if (v->fX() < minx) minx = v->fX();
			else if (v->fX() > maxx) maxx = v->fX();
			if (v->fY() < miny) miny = v->fY();
			else if (v->fY() > maxy) maxy = v->fY();
		}
	}

	MinX = FLOAT2FIXED(minx);
	MinY = FLOAT2FIXED(miny);
	MaxX = FLOAT2FIXED(maxx);
	MaxY = FLOAT2FIXED(maxy);
}